

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
               *visited)

{
  SymbolKind SVar1;
  size_type sVar2;
  pointer ppTVar3;
  Type *this;
  ClassType *pCVar4;
  long lVar5;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar6;
  Type *iface;
  ClassType *local_48;
  ClassType *local_40;
  ClassType *local_38;
  
  if (type->isInterface == true) {
    local_48 = type;
    pVar6 = ska::detailv3::
            sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
            ::emplace<slang::ast::Symbol_const*>
                      ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                        *)&visited->
                           super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                       ,(Symbol **)&local_48);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_48 = type;
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_48);
    }
  }
  if ((type->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&type->super_Scope);
  }
  sVar2 = (type->implementsIfaces).size_;
  local_40 = type;
  if (sVar2 != 0) {
    ppTVar3 = (type->implementsIfaces).data_;
    lVar5 = 0;
    do {
      local_48 = *(ClassType **)((long)ppTVar3 + lVar5);
      local_38 = local_48;
      pVar6 = ska::detailv3::
              sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
              ::emplace<slang::ast::Symbol_const*>
                        ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                          *)&visited->
                             super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                         ,(Symbol **)&local_48);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*const&>
                  ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_38);
      }
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  pCVar4 = local_40;
  if ((local_40->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&local_40->super_Scope);
  }
  this = pCVar4->baseClass;
  if (this != (Type *)0x0) {
    pCVar4 = (ClassType *)this->canonical;
    if (pCVar4 == (ClassType *)0x0) {
      Type::resolveCanonical(this);
      pCVar4 = (ClassType *)this->canonical;
    }
    SVar1 = (pCVar4->super_Type).super_Symbol.kind;
    if (SVar1 == ClassType) {
      findIfaces(pCVar4,ifaces,visited);
    }
    else if (SVar1 != ErrorType) {
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassType]");
    }
  }
  return;
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}